

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnCatchAllExpr(BinaryReaderIR *this)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Expr *pEVar2;
  _func_int ***ppp_Var3;
  Result RVar4;
  Catch local_a8;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_a8.loc.filename._M_len = strlen(__s);
  local_a8.loc.field_1.field_0.last_column = 0;
  local_a8.loc.filename._M_str = __s;
  local_a8.loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_a8.var);
  local_a8.exprs.first_ = (Expr *)0x0;
  local_a8.exprs.last_ = (Expr *)0x0;
  local_a8.exprs.size_ = 0;
  RVar4 = AppendCatch(this,&local_a8);
  pEVar2 = local_a8.exprs.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var3 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  local_a8.exprs.first_ = (Expr *)0x0;
  local_a8.exprs.last_ = (Expr *)0x0;
  local_a8.exprs.size_ = 0;
  Var::~Var(&local_a8.var);
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchAllExpr() {
  return AppendCatch(Catch(GetLocation()));
}